

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4_int8.h
# Opt level: O0

void ncnn::conv3x3s2_pack1to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  long in_RCX;
  long in_RSI;
  long *in_RDI;
  int j;
  int i;
  char *sptr;
  int v;
  int u;
  char *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00000950;
  Mat *in_stack_00000958;
  Mat *in_stack_00000960;
  Mat *in_stack_00000968;
  undefined8 in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  int local_330;
  int local_32c;
  undefined1 *local_328;
  int local_320;
  int local_31c;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  Allocator *in_stack_fffffffffffffd00;
  undefined1 *local_2d0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  int local_270;
  int local_26c;
  void *local_268;
  int *local_260;
  long local_258;
  undefined4 local_250;
  long *local_248;
  undefined4 local_240;
  int local_23c;
  int local_238;
  undefined4 local_234;
  undefined4 local_230;
  long local_228;
  undefined4 local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  long *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  void **local_1d0;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  undefined8 *local_188;
  undefined8 *local_178;
  undefined1 local_16d;
  int local_16c;
  void **local_168;
  undefined8 *local_160;
  undefined1 local_13d;
  int local_13c;
  undefined8 *local_130;
  void *local_e8;
  undefined8 local_d8;
  undefined4 local_cc;
  undefined8 local_c8;
  int local_bc;
  undefined4 local_b8;
  int local_b4;
  void **local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  long local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  long *local_70;
  undefined4 local_64;
  long local_60;
  undefined1 *local_58;
  undefined4 local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_20c = *(int *)((long)in_RDI + 0x2c);
  local_210 = (int)in_RDI[7];
  local_214 = *(int *)(in_RSI + 0x2c);
  local_218 = *(int *)(in_RSI + 0x30);
  local_21c = local_214 * local_218;
  local_220 = 9;
  local_d8 = *(undefined8 *)(in_RCX + 0x10);
  local_b0 = &local_268;
  local_b8 = 9;
  local_c8 = 1;
  local_cc = 1;
  local_268 = (void *)0x0;
  local_260 = (int *)0x0;
  local_258 = 0;
  local_250 = 0;
  local_248 = (long *)0x0;
  local_240 = 0;
  local_23c = 0;
  local_238 = 0;
  local_234 = 0;
  local_230 = 0;
  local_228 = 0;
  local_1f0 = in_RDI;
  local_bc = local_210;
  local_b4 = local_21c;
  Mat::create(in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
              (int)in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
              in_stack_fffffffffffffc88,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
              in_stack_fffffffffffffd00);
  local_26c = local_20c * 2 + local_214 * -2;
  for (local_270 = 0; local_270 < local_210; local_270 = local_270 + 1) {
    local_130 = &local_2b8;
    local_7c = *(int *)((long)local_1f0 + 0x2c);
    local_80 = (int)local_1f0[6];
    local_84 = *(undefined4 *)((long)local_1f0 + 0x34);
    local_90 = *local_1f0 + local_1f0[8] * (long)local_270 * local_1f0[2];
    local_98 = local_1f0[2];
    local_9c = (undefined4)local_1f0[3];
    local_a8 = local_1f0[4];
    local_78 = &local_2b8;
    local_20 = (long)local_7c * (long)local_80 * local_98;
    local_160 = &local_318;
    local_168 = &local_268;
    local_58 = (undefined1 *)((long)local_268 + local_228 * local_270 * local_258);
    local_40 = &local_318;
    local_30 = (long)local_23c * (long)local_238 * local_258;
    local_18 = &local_318;
    local_1e8 = &local_318;
    local_318 = 0;
    local_308 = 0;
    local_310 = 0;
    local_2d0 = local_58;
    for (local_31c = 0; local_31c < 3; local_31c = local_31c + 1) {
      for (local_320 = 0; local_320 < 3; local_320 = local_320 + 1) {
        local_8 = &local_2b8;
        local_c = local_31c;
        local_328 = (undefined1 *)
                    (local_90 + (long)local_7c * (long)local_31c * local_98 + (long)local_320);
        for (local_32c = 0; local_32c < local_218; local_32c = local_32c + 1) {
          for (local_330 = 0; local_330 + 3 < local_214; local_330 = local_330 + 4) {
            *local_2d0 = *local_328;
            local_2d0[1] = local_328[2];
            local_2d0[2] = local_328[4];
            local_2d0[3] = local_328[6];
            local_328 = local_328 + 8;
            local_2d0 = local_2d0 + 4;
          }
          for (; local_330 + 1 < local_214; local_330 = local_330 + 2) {
            *local_2d0 = *local_328;
            local_2d0[1] = local_328[2];
            local_328 = local_328 + 4;
            local_2d0 = local_2d0 + 2;
          }
          for (; local_330 < local_214; local_330 = local_330 + 1) {
            *local_2d0 = *local_328;
            local_328 = local_328 + 2;
            local_2d0 = local_2d0 + 1;
          }
          local_328 = local_328 + local_26c;
        }
      }
    }
    local_1e0 = &local_2b8;
    local_24 = 0x10;
    local_34 = 0x10;
    local_44 = local_23c;
    local_48 = local_238;
    local_4c = local_234;
    local_60 = local_258;
    local_64 = local_250;
    local_70 = local_248;
    local_13c = local_270;
    local_13d = 1;
    local_16c = local_270;
    local_16d = 1;
    local_2b8 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_290 = 0;
    local_28c = 0;
    local_288 = 0;
    local_284 = 0;
    local_280 = 0;
    local_278 = 0;
    local_2b0 = 0;
    local_188 = local_1e0;
    local_178 = local_1e8;
    local_298 = local_a8;
  }
  im2col_sgemm_pack1to4_int8_sse
            (in_stack_00000968,in_stack_00000960,in_stack_00000958,in_stack_00000950);
  local_1d0 = &local_268;
  if (local_260 != (int *)0x0) {
    local_1ac = 0xffffffff;
    LOCK();
    local_1b0 = *local_260;
    *local_260 = *local_260 + -1;
    UNLOCK();
    if (local_1b0 == 1) {
      local_1a8 = local_1d0;
      if (local_248 == (long *)0x0) {
        local_e8 = local_268;
        if (local_268 != (void *)0x0) {
          free(local_268);
        }
      }
      else {
        (**(code **)(*local_248 + 0x18))(local_248,local_268);
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s2_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = 9;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 1u, 1, opt.workspace_allocator);
    {
        const int gap = w * 2 - outw * 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            signed char* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < 3; u++)
            {
                for (int v = 0; v < 3; v++)
                {
                    const signed char* sptr = img.row<const signed char>(u) + v;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j + 3 < outw; j += 4)
                        {
                            ptr[0] = sptr[0];
                            ptr[1] = sptr[2];
                            ptr[2] = sptr[4];
                            ptr[3] = sptr[6];

                            sptr += 8;
                            ptr += 4;
                        }
                        for (; j + 1 < outw; j += 2)
                        {
                            ptr[0] = sptr[0];
                            ptr[1] = sptr[2];

                            sptr += 4;
                            ptr += 2;
                        }
                        for (; j < outw; j++)
                        {
                            ptr[0] = sptr[0];

                            sptr += 2;
                            ptr += 1;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}